

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O2

void __thiscall
pstore::error_or<std::tuple<int,pstore::maybe<unsigned_char,void>>>::
error_or<int&,pstore::maybe<unsigned_char,void>>
          (error_or<std::tuple<int,pstore::maybe<unsigned_char,void>>> *this,int *param_2,
          maybe<unsigned_char,_void> *param_3)

{
  tuple<int,_pstore::maybe<unsigned_char,_void>_> *this_00;
  
  this[0x10] = (error_or<std::tuple<int,pstore::maybe<unsigned_char,void>>>)0x0;
  this_00 = value_storage_impl<pstore::error_or<std::tuple<int,pstore::maybe<unsigned_char,void>>>&,std::tuple<int,pstore::maybe<unsigned_char,void>>>
                      ((error_or<std::tuple<int,_pstore::maybe<unsigned_char,_void>_>_> *)this);
  std::tuple<int,_pstore::maybe<unsigned_char,_void>_>::
  tuple<int_&,_pstore::maybe<unsigned_char,_void>,_true>(this_00,param_2,param_3);
  return;
}

Assistant:

explicit error_or (in_place_t const inp, Args &&... args)
                : has_error_{false} {
            (void) inp;
            new (get_storage ()) storage_type (std::forward<Args> (args)...);
        }